

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::DrawConsistancy(DBaseStatusBar *this)

{
  int iVar1;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar2;
  short *psVar3;
  long lVar4;
  char *pcVar5;
  char conbuff [64];
  
  if (netgame) {
    psVar3 = &DAT_017e1f32;
    lVar4 = 0;
    pcVar5 = (char *)0x0;
    do {
      if ((playeringame[lVar4] == true) && (*psVar3 != 0)) {
        if (pcVar5 == (char *)0x0) {
          builtin_strncpy(conbuff,"Out of sync with:",0x12);
          pcVar5 = conbuff + 0x11;
        }
        *pcVar5 = ' ';
        pcVar5[1] = (char)lVar4 + '1';
        pcVar5[2] = '\0';
        pcVar5 = pcVar5 + 2;
      }
      lVar4 = lVar4 + 1;
      psVar3 = psVar3 + 0x150;
    } while (lVar4 != 8);
    if (pcVar5 != (char *)0x0) {
      if (DrawConsistancy()::firsttime == '\0') {
        DrawConsistancy()::firsttime = '\x01';
        if (debugfile != (FILE *)0x0) {
          fprintf((FILE *)debugfile,"%s as of tic %d (%d)\n",conbuff);
        }
      }
      this_00 = screen;
      font = SmallFont;
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar2 = FFont::StringWidth(SmallFont,(BYTE *)conbuff);
      DCanvas::DrawText((DCanvas *)this_00,font,3,(iVar1 - iVar2 * CleanXfac) / 2,0,conbuff,
                        0x40001393,1,0);
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawConsistancy () const
{
	static bool firsttime = true;
	int i;
	char conbuff[64], *buff_p;

	if (!netgame)
		return;

	buff_p = NULL;
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i] && players[i].inconsistant)
		{
			if (buff_p == NULL)
			{
				strcpy (conbuff, "Out of sync with:");
				buff_p = conbuff + 17;
			}
			*buff_p++ = ' ';
			*buff_p++ = '1' + i;
			*buff_p = 0;
		}
	}

	if (buff_p != NULL)
	{
		if (firsttime)
		{
			firsttime = false;
			if (debugfile)
			{
				fprintf (debugfile, "%s as of tic %d (%d)\n", conbuff,
					players[1-consoleplayer].inconsistant,
					players[1-consoleplayer].inconsistant/ticdup);
			}
		}
		screen->DrawText (SmallFont, CR_GREEN, 
			(screen->GetWidth() - SmallFont->StringWidth (conbuff)*CleanXfac) / 2,
			0, conbuff, DTA_CleanNoMove, true, TAG_DONE);
		BorderTopRefresh = screen->GetPageCount ();
	}
}